

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O2

void __thiscall FNodeBuilder::FLevel::FindMapBounds(FLevel *this)

{
  double dVar1;
  vertex_t vVar2;
  long lVar3;
  int iVar4;
  line_t_conflict *plVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  vVar2.p = this->Vertices->p;
  uVar6 = vVar2.p.X._0_4_;
  uVar8 = vVar2.p.X._4_4_;
  uVar7 = vVar2.p.Y._0_4_;
  uVar9 = vVar2.p.Y._4_4_;
  lVar3 = 1;
  dVar10 = vVar2.p.X;
  dVar11 = vVar2.p.Y;
  do {
    if (this->NumLines <= lVar3) {
      this->MinX = SUB84((double)CONCAT44(uVar8,uVar6) + 103079215104.0,0);
      this->MinY = SUB84((double)CONCAT44(uVar9,uVar7) + 103079215104.0,0);
      this->MaxX = SUB84(dVar10 + 103079215104.0,0);
      this->MaxY = SUB84(dVar11 + 103079215104.0,0);
      return;
    }
    iVar4 = 2;
    while (iVar4 != 0) {
      plVar5 = (line_t_conflict *)&this->Lines[lVar3].v2;
      if (iVar4 == 2) {
        plVar5 = this->Lines + lVar3;
      }
      dVar1 = (plVar5->v1->p).X;
      dVar12 = dVar1;
      if (((double)CONCAT44(uVar8,uVar6) < dVar1 || (double)CONCAT44(uVar8,uVar6) == dVar1) &&
         (dVar12 = (double)CONCAT44(uVar8,uVar6), dVar10 < dVar1)) {
        dVar10 = dVar1;
      }
      dVar1 = (plVar5->v1->p).Y;
      if ((double)CONCAT44(uVar9,uVar7) < dVar1 || (double)CONCAT44(uVar9,uVar7) == dVar1) {
        if (dVar1 <= dVar11) goto LAB_003bffd3;
      }
      else {
        uVar7 = SUB84(dVar1,0);
        uVar9 = (undefined4)((ulong)dVar1 >> 0x20);
LAB_003bffd3:
        dVar1 = dVar11;
      }
      dVar11 = dVar1;
      uVar6 = SUB84(dVar12,0);
      uVar8 = (undefined4)((ulong)dVar12 >> 0x20);
      iVar4 = iVar4 + -1;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void FNodeBuilder::FLevel::FindMapBounds()
{
	double minx, maxx, miny, maxy;

	minx = maxx = Vertices[0].fX();
	miny = maxy = Vertices[0].fY();

	for (int i = 1; i < NumLines; ++i)
	{
		for (int j = 0; j < 2; j++)
		{
			vertex_t *v = (j == 0 ? Lines[i].v1 : Lines[i].v2);
			if (v->fX() < minx) minx = v->fX();
			else if (v->fX() > maxx) maxx = v->fX();
			if (v->fY() < miny) miny = v->fY();
			else if (v->fY() > maxy) maxy = v->fY();
		}
	}

	MinX = FLOAT2FIXED(minx);
	MinY = FLOAT2FIXED(miny);
	MaxX = FLOAT2FIXED(maxx);
	MaxY = FLOAT2FIXED(maxy);
}